

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

void __thiscall
helics::ValueFederateManager::setDefaultValue
          (ValueFederateManager *this,Input *inp,data_view *block)

{
  string_view message;
  bool bVar1;
  undefined8 uVar2;
  long in_RSI;
  size_t in_RDI;
  InputData *info;
  data_view *in_stack_ffffffffffffff48;
  data_view *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  shared_ptr<const_helics::SmallBuffer> *dt;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  data_view *this_00;
  unsigned_long *in_stack_ffffffffffffff70;
  char **in_stack_ffffffffffffff78;
  shared_ptr<const_helics::SmallBuffer> local_60;
  data_view local_50;
  long local_20;
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = Interface::isValid((Interface *)0x29a2b9);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    message._M_str = (char *)in_stack_ffffffffffffff70;
    message._M_len = in_RDI;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_ffffffffffffff60,message);
    __cxa_throw(uVar2,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  local_20 = *(long *)(local_10 + 0x48);
  data_view::data((data_view *)0x29a2e3);
  data_view::size((data_view *)0x29a2f5);
  dt = &local_60;
  std::make_shared<helics::SmallBuffer,char_const*,unsigned_long>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  this_00 = &local_50;
  std::shared_ptr<helics::SmallBuffer_const>::shared_ptr<helics::SmallBuffer,void>
            ((shared_ptr<const_helics::SmallBuffer> *)in_stack_ffffffffffffff50,
             (shared_ptr<helics::SmallBuffer> *)in_stack_ffffffffffffff48);
  data_view::data_view(this_00,dt);
  data_view::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  data_view::~data_view((data_view *)0x29a358);
  std::shared_ptr<const_helics::SmallBuffer>::~shared_ptr
            ((shared_ptr<const_helics::SmallBuffer> *)0x29a362);
  std::shared_ptr<helics::SmallBuffer>::~shared_ptr((shared_ptr<helics::SmallBuffer> *)0x29a36c);
  *(undefined8 *)(local_20 + 0x28) = *(undefined8 *)(in_RDI + 0x1f8);
  return;
}

Assistant:

void ValueFederateManager::setDefaultValue(const Input& inp, const data_view& block)
{
    if (inp.isValid()) {
        auto* info = static_cast<InputData*>(inp.dataReference);

        /** copy the data first since we are not entirely sure of the lifetime of the data_view*/
        info->lastData = data_view(std::make_shared<SmallBuffer>(block.data(), block.size()));
        info->lastUpdate = CurrentTime;
    } else {
        throw(InvalidIdentifier("Input id is invalid"));
    }
}